

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

wchar_t Compiler_compile(Compiler *compiler,GherkinDocument *gherkin_document,wchar_t *source)

{
  Feature *pFVar1;
  
  pFVar1 = gherkin_document->feature;
  if (pFVar1 != (Feature *)0x0) {
    compile_scenario_container
              (compiler,pFVar1->child_definitions,pFVar1->tags,(Tags *)0x0,gherkin_document->uri,
               pFVar1->language,L'\0',(Steps *)0x0);
  }
  return L'\0';
}

Assistant:

int Compiler_compile(Compiler* compiler, const GherkinDocument* gherkin_document, const wchar_t* source) {
    const Feature* feature = gherkin_document->feature;
    if (!feature) {
        return 0;
    }
    int background_step_count = 0;
    const Steps* background_steps = 0;
    compile_scenario_container(compiler, feature->child_definitions, feature->tags, (Tags*)0, gherkin_document->uri, feature->language, background_step_count, background_steps);
    return 0;
}